

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-xform.cc
# Opt level: O2

void xformOp_test(void)

{
  double *pdVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  ostream *poVar4;
  matrix4d *n;
  bool resetXformStack;
  matrix4d m;
  string err;
  double3 scale;
  matrix4d c;
  Xformable x;
  
  scale._M_elems[2] = 3.0;
  c.m[0][1] = (double)(c.m[0] + 3);
  c.m[0][2] = 0.0;
  c.m[0][3]._0_1_ = 0;
  c.m[1][3] = (double)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  c.m[1][1] = 0.0;
  scale._M_elems[0] = 1.0;
  scale._M_elems[1] = 2.0;
  c.m[2][0]._0_1_ = 0;
  c.m[2][1] = 0.0;
  c.m[2][2]._0_1_ = 0;
  c.m[2][2]._1_7_ = 0;
  c.m[2][3]._0_1_ = 0;
  c.m[2][3]._1_7_ = 0;
  c.m[3][0]._0_1_ = 0;
  c.m[3][1]._0_1_ = 0;
  c.m[0][0] = (double)CONCAT35(c.m[0][0]._5_3_,0x100000002);
  linb::any::operator=((any *)(c.m[1] + 1),&scale);
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x._dirty = true;
  x._matrix.m[0][0] = 1.0;
  x._matrix.m[0][1] = 0.0;
  x._matrix.m[0][2] = 0.0;
  x._matrix.m[0][3] = 0.0;
  x._matrix.m[1][0] = 0.0;
  x._matrix.m[1][1] = 1.0;
  x._matrix.m[1][2] = 0.0;
  x._matrix.m[1][3] = 0.0;
  x._matrix.m[2][0] = 0.0;
  x._matrix.m[2][1] = 0.0;
  x._matrix.m[2][2] = 1.0;
  x._matrix.m[2][3] = 0.0;
  x._matrix.m[3][0] = 0.0;
  x._matrix.m[3][1] = 0.0;
  x._matrix.m[3][2] = 0.0;
  x._matrix.m[3][3] = 1.0;
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            (&x.xformOps,(value_type *)&c);
  m.m[0][0] = 1.0;
  m.m[0][1] = 0.0;
  m.m[0][2] = 0.0;
  m.m[0][3] = 0.0;
  m.m[1][0] = 0.0;
  m.m[1][1] = 1.0;
  m.m[1][2] = 0.0;
  m.m[1][3] = 0.0;
  m.m[2][0] = 0.0;
  m.m[2][1] = 0.0;
  m.m[2][2]._0_1_ = 0;
  m.m[2][2]._1_7_ = 0x3ff00000000000;
  m.m[2][3]._0_1_ = 0;
  m.m[2][3]._1_7_ = 0;
  m.m[3][0]._0_1_ = 0;
  m.m[3][0]._1_7_ = 0;
  m.m[3][1] = 0.0;
  m.m[3][2] = 0.0;
  m.m[3][3] = 1.0;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar3 = tinyusdz::Xformable::EvaluateXformOps(&x,NAN,Held,&m,&resetXformStack,&err);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x2a,"%s","ret == true");
  acutest_check_((uint)(ABS(m.m[0][0] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x2c,"%s","float_equals(m.m[0][0], 1.0)");
  acutest_check_((uint)(ABS(m.m[1][1] + -0.5) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x2d,"%s","float_equals(m.m[1][1], 1.0/2.0)");
  n = (matrix4d *)0x204471;
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][2]._1_7_,m.m[2][2]._0_1_) + -0.3333333333333333)
                       < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x2e,"%s","float_equals(m.m[2][2], 1.0/3.0)");
  std::__cxx11::string::~string((string *)&err);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::~vector(&x.xformOps);
  tinyusdz::XformOp::~XformOp((XformOp *)&c);
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
  x._dirty = false;
  x._25_7_ = 0;
  x._matrix.m[0][0] = 0.0;
  x._matrix.m[0][1] = 1.0;
  x._matrix.m[0][2] = 0.0;
  x._matrix.m[0][3] = 0.0;
  x._matrix.m[1][0] = -1.0;
  x._matrix.m[1][3] = 0.0;
  x._matrix.m[1][1] = 0.0;
  x._matrix.m[1][2] = 0.0;
  x._matrix.m[2][0] = 0.44200000166893005;
  x._matrix.m[2][1] = -7.5320000648498535;
  m.m[0][0] = 1.0;
  m.m[0][1] = 0.0;
  m.m[0][2] = 0.0;
  m.m[0][3] = 0.0;
  m.m[1][0] = 0.0;
  m.m[1][1] = 1.0;
  m.m[1][2] = 0.0;
  m.m[1][3] = 0.0;
  m.m[2][0] = 0.0;
  m.m[2][1] = 0.0;
  m.m[2][2]._0_1_ = 0;
  m.m[2][2]._1_7_ = 0x3ff00000000000;
  m.m[3][1] = 0.0;
  x._matrix.m[2][2] = 18.611000061035156;
  x._matrix.m[2][3] = 1.0;
  m.m[2][3]._0_1_ = 0;
  m.m[2][3]._1_7_ = 0;
  m.m[3][0]._0_1_ = 0;
  m.m[3][0]._1_7_ = 0;
  m.m[3][2] = -30.0;
  m.m[3][3] = 1.0;
  tinyusdz::value::Mult<tinyusdz::value::matrix4d,double,4ul>(&c,(value *)&x,&m,n);
  poVar4 = std::operator<<((ostream *)&std::cout,&c);
  std::operator<<(poVar4,"\n");
  acutest_check_((uint)(ABS(c.m[0][0]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x4d,"%s","float_equals(c.m[0][0], 0.0)");
  acutest_check_((uint)(ABS(c.m[0][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x4e,"%s","float_equals(c.m[0][1], 0.0)");
  acutest_check_((uint)(ABS(c.m[0][2] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x4f,"%s","float_equals(c.m[0][2], 1.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(c.m[0][3]._1_7_,c.m[0][3]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x50,"%s","float_equals(c.m[0][3], 0.0)");
  acutest_check_((uint)(ABS(c.m[1][0]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x52,"%s","float_equals(c.m[1][0], 0.0)");
  acutest_check_((uint)(ABS(c.m[1][1] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x53,"%s","float_equals(c.m[1][1], 1.0)");
  acutest_check_((uint)(ABS(c.m[1][2]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x54,"%s","float_equals(c.m[1][2], 0.0)");
  acutest_check_((uint)(ABS(c.m[1][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x55,"%s","float_equals(c.m[1][3], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(c.m[2][0]._1_7_,c.m[2][0]._0_1_) + 1.0) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x57,"%s","float_equals(c.m[2][0], -1.0)");
  acutest_check_((uint)(ABS(c.m[2][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x58,"%s","float_equals(c.m[2][1], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(c.m[2][2]._1_7_,c.m[2][2]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x59,"%s","float_equals(c.m[2][2], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(c.m[2][3]._1_7_,c.m[2][3]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x5a,"%s","float_equals(c.m[2][3], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(c.m[3][0]._1_7_,c.m[3][0]._0_1_) + -0.442) < 1e-05),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x5c,"%s","float_equals(c.m[3][0], 0.442, 0.00001)");
  acutest_check_((uint)(ABS((double)CONCAT71(c.m[3][1]._1_7_,c.m[3][1]._0_1_) + 7.532) < 1e-05),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x5d,"%s","float_equals(c.m[3][1], -7.532, 0.00001)");
  acutest_check_((uint)(ABS(c.m[3][2] + 11.389) < 1e-05),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x5e,"%s","float_equals(c.m[3][2], -11.389, 0.00001)");
  acutest_check_((uint)(ABS(c.m[3][3] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x5f,"%s","float_equals(c.m[3][3], 1.0)");
  scale._M_elems[2] = 0.0;
  pdVar1 = c.m[0] + 3;
  c.m[0][2] = 0.0;
  c.m[0][3]._0_1_ = 0;
  c.m[1][3] = (double)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  c.m[1][1] = 0.0;
  scale._M_elems[0] = 90.0;
  scale._M_elems[1] = 0.0;
  c.m[2][0]._0_1_ = 0;
  c.m[2][1] = 0.0;
  c.m[2][2]._0_1_ = 0;
  c.m[2][2]._1_7_ = 0;
  c.m[2][3]._0_1_ = 0;
  c.m[2][3]._1_7_ = 0;
  c.m[3][0]._0_1_ = 0;
  c.m[3][1]._0_1_ = 0;
  c.m[0][0] = (double)CONCAT35(c.m[0][0]._5_3_,6);
  c.m[0][1] = (double)pdVar1;
  linb::any::operator=((any *)(c.m[1] + 1),&scale);
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  x._dirty = true;
  x._matrix.m[0][0] = 1.0;
  x._matrix.m[0][1] = 0.0;
  x._matrix.m[0][2] = 0.0;
  x._matrix.m[0][3] = 0.0;
  x._matrix.m[1][0] = 0.0;
  x._matrix.m[1][1] = 1.0;
  x._matrix.m[1][2] = 0.0;
  x._matrix.m[1][3] = 0.0;
  x._matrix.m[2][0] = 0.0;
  x._matrix.m[2][1] = 0.0;
  x._matrix.m[2][2] = 1.0;
  x._matrix.m[2][3] = 0.0;
  x._matrix.m[3][0] = 0.0;
  x._matrix.m[3][1] = 0.0;
  x._matrix.m[3][2] = 0.0;
  x._matrix.m[3][3] = 1.0;
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            (&x.xformOps,(value_type *)&c);
  paVar2 = &err.field_2;
  m.m[0][0] = 1.0;
  m.m[0][1] = 0.0;
  m.m[0][2] = 0.0;
  m.m[0][3] = 0.0;
  m.m[1][0] = 0.0;
  m.m[1][1] = 1.0;
  m.m[1][2] = 0.0;
  m.m[1][3] = 0.0;
  m.m[2][0] = 0.0;
  m.m[2][1] = 0.0;
  m.m[2][2]._0_1_ = 0;
  m.m[2][2]._1_7_ = 0x3ff00000000000;
  m.m[2][3]._0_1_ = 0;
  m.m[2][3]._1_7_ = 0;
  m.m[3][0]._0_1_ = 0;
  m.m[3][0]._1_7_ = 0;
  m.m[3][1] = 0.0;
  m.m[3][2] = 0.0;
  m.m[3][3] = 1.0;
  err._M_string_length = 0;
  err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
  err._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = tinyusdz::Xformable::EvaluateXformOps(&x,NAN,Held,&m,&resetXformStack,&err);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x78,"%s","ret");
  poVar4 = std::operator<<((ostream *)&std::cout,"rotXYZ = ");
  poVar4 = std::operator<<(poVar4,&m);
  std::operator<<(poVar4,"\n");
  acutest_check_((uint)(ABS(m.m[0][0] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x7f,"%s","float_equals(m.m[0][0], 1.0)");
  acutest_check_((uint)(ABS(m.m[0][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x80,"%s","float_equals(m.m[0][1], 0.0)");
  acutest_check_((uint)(ABS(m.m[0][2]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x81,"%s","float_equals(m.m[0][2], 0.0)");
  acutest_check_((uint)(ABS(m.m[0][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x82,"%s","float_equals(m.m[0][3], 0.0)");
  acutest_check_((uint)(ABS(m.m[1][0]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x84,"%s","float_equals(m.m[1][0], 0.0)");
  acutest_check_((uint)(ABS(m.m[1][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x85,"%s","float_equals(m.m[1][1], 0.0)");
  acutest_check_((uint)(ABS(m.m[1][2] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x86,"%s","float_equals(m.m[1][2], 1.0)");
  acutest_check_((uint)(ABS(m.m[1][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x87,"%s","float_equals(m.m[1][3], 0.0)");
  acutest_check_((uint)(ABS(m.m[2][0]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x89,"%s","float_equals(m.m[2][0], 0.0)");
  acutest_check_((uint)(ABS(m.m[2][1] + 1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x8a,"%s","float_equals(m.m[2][1], -1.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][2]._1_7_,m.m[2][2]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x8b,"%s","float_equals(m.m[2][2], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][3]._1_7_,m.m[2][3]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x8c,"%s","float_equals(m.m[2][3], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[3][0]._1_7_,m.m[3][0]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x8e,"%s","float_equals(m.m[3][0], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x8f,"%s","float_equals(m.m[3][1], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][2]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x90,"%s","float_equals(m.m[3][2], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][3] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x91,"%s","float_equals(m.m[3][3], 1.0)");
  std::__cxx11::string::~string((string *)&err);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::~vector(&x.xformOps);
  tinyusdz::XformOp::~XformOp((XformOp *)&c);
  c.m[0][2] = 0.0;
  scale._M_elems[2] = -65.66769;
  c.m[0][3]._0_1_ = 0;
  c.m[1][3] = (double)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  c.m[1][1] = 0.0;
  scale._M_elems[0] = 0.0;
  scale._M_elems[1] = 0.0;
  c.m[2][0]._0_1_ = 0;
  c.m[2][1] = 0.0;
  c.m[2][2]._0_1_ = 0;
  c.m[2][2]._1_7_ = 0;
  c.m[2][3]._0_1_ = 0;
  c.m[2][3]._1_7_ = 0;
  c.m[3][0]._0_1_ = 0;
  c.m[3][1]._0_1_ = 0;
  c.m[0][0] = (double)CONCAT35(c.m[0][0]._5_3_,6);
  c.m[0][1] = (double)pdVar1;
  linb::any::operator=((any *)(c.m[1] + 1),&scale);
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  x._dirty = true;
  x._matrix.m[0][0] = 1.0;
  x._matrix.m[0][1] = 0.0;
  x._matrix.m[0][2] = 0.0;
  x._matrix.m[0][3] = 0.0;
  x._matrix.m[1][0] = 0.0;
  x._matrix.m[1][1] = 1.0;
  x._matrix.m[1][2] = 0.0;
  x._matrix.m[1][3] = 0.0;
  x._matrix.m[2][0] = 0.0;
  x._matrix.m[2][1] = 0.0;
  x._matrix.m[2][2] = 1.0;
  x._matrix.m[2][3] = 0.0;
  x._matrix.m[3][0] = 0.0;
  x._matrix.m[3][1] = 0.0;
  x._matrix.m[3][2] = 0.0;
  x._matrix.m[3][3] = 1.0;
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            (&x.xformOps,(value_type *)&c);
  m.m[0][0] = 1.0;
  m.m[0][1] = 0.0;
  m.m[0][2] = 0.0;
  m.m[0][3] = 0.0;
  m.m[1][0] = 0.0;
  m.m[1][1] = 1.0;
  m.m[1][2] = 0.0;
  m.m[1][3] = 0.0;
  m.m[2][0] = 0.0;
  m.m[2][1] = 0.0;
  m.m[2][2]._0_1_ = 0;
  m.m[2][2]._1_7_ = 0x3ff00000000000;
  m.m[2][3]._0_1_ = 0;
  m.m[2][3]._1_7_ = 0;
  m.m[3][0]._0_1_ = 0;
  m.m[3][0]._1_7_ = 0;
  m.m[3][1] = 0.0;
  m.m[3][2] = 0.0;
  m.m[3][3] = 1.0;
  err._M_string_length = 0;
  err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
  err._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = tinyusdz::Xformable::EvaluateXformOps(&x,NAN,Held,&m,&resetXformStack,&err);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xab,"%s","ret");
  poVar4 = std::operator<<((ostream *)&std::cout,"rotXYZ = ");
  poVar4 = std::operator<<(poVar4,&m);
  std::operator<<(poVar4,"\n");
  acutest_check_((uint)(ABS(m.m[0][0] + -0.4120283041870241) < 1e-05),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb3,"%s","float_equals(m.m[0][0], 0.4120283041870241, 0.00001)");
  acutest_check_((uint)(ABS(m.m[0][1] + 0.9111710468121587) < 1e-05),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb4,"%s","float_equals(m.m[0][1], -0.9111710468121587, 0.00001)");
  acutest_check_((uint)(ABS(m.m[0][2]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb5,"%s","float_equals(m.m[0][2], 0.0)");
  acutest_check_((uint)(ABS(m.m[0][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb6,"%s","float_equals(m.m[0][3], 0.0)");
  acutest_check_((uint)(ABS(m.m[1][0] + -0.9111710468121587) < 1e-05),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb8,"%s","float_equals(m.m[1][0], 0.9111710468121587, 0.00001)");
  acutest_check_((uint)(ABS(m.m[1][1] + -0.4120283041870241) < 1e-05),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xb9,"%s","float_equals(m.m[1][1], 0.4120283041870241, 0.00001)");
  acutest_check_((uint)(ABS(m.m[1][2]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xba,"%s","float_equals(m.m[1][2], 0.0)");
  acutest_check_((uint)(ABS(m.m[1][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xbb,"%s","float_equals(m.m[1][3], 0.0)");
  acutest_check_((uint)(ABS(m.m[2][0]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xbd,"%s","float_equals(m.m[2][0], 0.0)");
  acutest_check_((uint)(ABS(m.m[2][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xbe,"%s","float_equals(m.m[2][1], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][2]._1_7_,m.m[2][2]._0_1_) + -1.0) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xbf,"%s","float_equals(m.m[2][2], 1.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][3]._1_7_,m.m[2][3]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xc0,"%s","float_equals(m.m[2][3], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[3][0]._1_7_,m.m[3][0]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xc2,"%s","float_equals(m.m[3][0], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xc3,"%s","float_equals(m.m[3][1], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][2]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xc4,"%s","float_equals(m.m[3][2], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][3] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xc5,"%s","float_equals(m.m[3][3], 1.0)");
  std::__cxx11::string::~string((string *)&err);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::~vector(&x.xformOps);
  tinyusdz::XformOp::~XformOp((XformOp *)&c);
  scale._M_elems[0] = 10.0;
  scale._M_elems[1] = 23.0;
  c.m[0][2] = 0.0;
  c.m[0][3]._0_1_ = 0;
  c.m[1][3] = (double)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  c.m[1][1] = 0.0;
  scale._M_elems[2] = 43.2;
  c.m[2][0]._0_1_ = 0;
  c.m[2][1] = 0.0;
  c.m[2][2]._0_1_ = 0;
  c.m[2][2]._1_7_ = 0;
  c.m[2][3]._0_1_ = 0;
  c.m[2][3]._1_7_ = 0;
  c.m[3][0]._0_1_ = 0;
  c.m[3][1]._0_1_ = 0;
  c.m[0][0] = (double)CONCAT35(c.m[0][0]._5_3_,6);
  c.m[0][1] = (double)pdVar1;
  linb::any::operator=((any *)(c.m[1] + 1),&scale);
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  x._dirty = true;
  x._matrix.m[0][0] = 1.0;
  x._matrix.m[0][1] = 0.0;
  x._matrix.m[0][2] = 0.0;
  x._matrix.m[0][3] = 0.0;
  x._matrix.m[1][0] = 0.0;
  x._matrix.m[1][1] = 1.0;
  x._matrix.m[1][2] = 0.0;
  x._matrix.m[1][3] = 0.0;
  x._matrix.m[2][0] = 0.0;
  x._matrix.m[2][1] = 0.0;
  x._matrix.m[2][2] = 1.0;
  x._matrix.m[2][3] = 0.0;
  x._matrix.m[3][0] = 0.0;
  x._matrix.m[3][1] = 0.0;
  x._matrix.m[3][2] = 0.0;
  x._matrix.m[3][3] = 1.0;
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            (&x.xformOps,(value_type *)&c);
  m.m[0][0] = 1.0;
  m.m[0][1] = 0.0;
  m.m[0][2] = 0.0;
  m.m[0][3] = 0.0;
  m.m[1][0] = 0.0;
  m.m[1][1] = 1.0;
  m.m[1][2] = 0.0;
  m.m[1][3] = 0.0;
  m.m[2][0] = 0.0;
  m.m[2][1] = 0.0;
  m.m[2][2]._0_1_ = 0;
  m.m[2][2]._1_7_ = 0x3ff00000000000;
  m.m[2][3]._0_1_ = 0;
  m.m[2][3]._1_7_ = 0;
  m.m[3][0]._0_1_ = 0;
  m.m[3][0]._1_7_ = 0;
  m.m[3][1] = 0.0;
  m.m[3][2] = 0.0;
  m.m[3][3] = 1.0;
  err._M_string_length = 0;
  err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
  err._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = tinyusdz::Xformable::EvaluateXformOps(&x,NAN,Held,&m,&resetXformStack,&err);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xdc,"%s","ret");
  poVar4 = std::operator<<((ostream *)&std::cout,"rotXYZ = ");
  poVar4 = std::operator<<(poVar4,&m);
  std::operator<<(poVar4,"\n");
  acutest_check_((uint)(ABS(m.m[0][0] + -0.6710191595559729) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xe4,"%s","float_equals(m.m[0][0], 0.6710191595559729, eps)");
  acutest_check_((uint)(ABS(m.m[0][1] + -0.6301289334241799) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xe5,"%s","float_equals(m.m[0][1], 0.6301289334241799, eps)");
  acutest_check_((uint)(ABS(m.m[0][2] + 0.39073112848927377) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xe6,"%s","float_equals(m.m[0][2], -0.39073112848927377, eps)");
  acutest_check_((uint)(ABS(m.m[0][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xe7,"%s","float_equals(m.m[0][3], 0.0)");
  acutest_check_((uint)(ABS(m.m[1][0] + 0.6246869592440953) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xe9,"%s","float_equals(m.m[1][0], -0.6246869592440953, eps)");
  acutest_check_((uint)(ABS(m.m[1][1] + -0.7643403049061097) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xea,"%s","float_equals(m.m[1][1], 0.7643403049061097, eps)");
  acutest_check_((uint)(ABS(m.m[1][2] + -0.15984399033558103) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xeb,"%s","float_equals(m.m[1][2], 0.15984399033558103, eps)");
  acutest_check_((uint)(ABS(m.m[1][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xec,"%s","float_equals(m.m[1][3], 0.0)");
  acutest_check_((uint)(ABS(m.m[2][0] + -0.3993738730302244) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xee,"%s","float_equals(m.m[2][0], 0.3993738730302244, eps)");
  acutest_check_((uint)(ABS(m.m[2][1] + -0.13682626048292368) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xef,"%s","float_equals(m.m[2][1], 0.13682626048292368, eps)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][2]._1_7_,m.m[2][2]._0_1_) + -0.9065203163653295)
                       < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf0,"%s","float_equals(m.m[2][2], 0.9065203163653295, eps)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][3]._1_7_,m.m[2][3]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf1,"%s","float_equals(m.m[2][3], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[3][0]._1_7_,m.m[3][0]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf3,"%s","float_equals(m.m[3][0], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf4,"%s","float_equals(m.m[3][1], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][2]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf5,"%s","float_equals(m.m[3][2], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][3] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0xf6,"%s","float_equals(m.m[3][3], 1.0)");
  std::__cxx11::string::~string((string *)&err);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::~vector(&x.xformOps);
  tinyusdz::XformOp::~XformOp((XformOp *)&c);
  c.m[0][1] = (double)(c.m[0] + 3);
  c.m[0][2] = 0.0;
  scale._M_elems[0] = -10.0;
  scale._M_elems[1] = 13.0;
  c.m[0][3]._0_1_ = 0;
  c.m[1][3] = (double)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  c.m[1][1] = 0.0;
  scale._M_elems[2] = 43.2;
  c.m[2][0]._0_1_ = 0;
  c.m[2][1] = 0.0;
  c.m[2][2]._0_1_ = 0;
  c.m[2][2]._1_7_ = 0;
  c.m[2][3]._0_1_ = 0;
  c.m[2][3]._1_7_ = 0;
  c.m[3][0]._0_1_ = 0;
  c.m[3][1]._0_1_ = 0;
  c.m[0][0] = (double)CONCAT35(c.m[0][0]._5_3_,0x100000006);
  linb::any::operator=((any *)(c.m[1] + 1),&scale);
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  x._dirty = true;
  x._matrix.m[0][0] = 1.0;
  x._matrix.m[0][1] = 0.0;
  x._matrix.m[0][2] = 0.0;
  x._matrix.m[0][3] = 0.0;
  x._matrix.m[1][0] = 0.0;
  x._matrix.m[1][1] = 1.0;
  x._matrix.m[1][2] = 0.0;
  x._matrix.m[1][3] = 0.0;
  x._matrix.m[2][0] = 0.0;
  x._matrix.m[2][1] = 0.0;
  x._matrix.m[2][2] = 1.0;
  x._matrix.m[2][3] = 0.0;
  x._matrix.m[3][0] = 0.0;
  x._matrix.m[3][1] = 0.0;
  x._matrix.m[3][2] = 0.0;
  x._matrix.m[3][3] = 1.0;
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            (&x.xformOps,(value_type *)&c);
  m.m[0][0] = 1.0;
  m.m[0][1] = 0.0;
  m.m[0][2] = 0.0;
  m.m[0][3] = 0.0;
  m.m[1][0] = 0.0;
  m.m[1][1] = 1.0;
  m.m[1][2] = 0.0;
  m.m[1][3] = 0.0;
  m.m[2][0] = 0.0;
  m.m[2][1] = 0.0;
  m.m[2][2]._0_1_ = 0;
  m.m[2][2]._1_7_ = 0x3ff00000000000;
  m.m[2][3]._0_1_ = 0;
  m.m[2][3]._1_7_ = 0;
  m.m[3][0]._0_1_ = 0;
  m.m[3][0]._1_7_ = 0;
  m.m[3][1] = 0.0;
  m.m[3][2] = 0.0;
  m.m[3][3] = 1.0;
  err._M_string_length = 0;
  err.field_2._M_allocated_capacity = err.field_2._M_allocated_capacity & 0xffffffffffffff00;
  err._M_dataplus._M_p = (pointer)paVar2;
  bVar3 = tinyusdz::Xformable::EvaluateXformOps(&x,NAN,Held,&m,&resetXformStack,&err);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x10d,"%s","ret");
  poVar4 = std::operator<<((ostream *)&std::cout,"rotXYZ = ");
  poVar4 = std::operator<<(poVar4,&m);
  std::operator<<(poVar4,"\n");
  acutest_check_((uint)(ABS(m.m[0][0] + -0.7102852087270047) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x114,"%s","float_equals(m.m[0][0], 0.7102852087270047, eps)");
  acutest_check_((uint)(ABS(m.m[0][1] + 0.7026225180689177) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x115,"%s","float_equals(m.m[0][1], -0.7026225180689177, eps)");
  acutest_check_((uint)(ABS(m.m[0][2] + -0.0426206448347375) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x116,"%s","float_equals(m.m[0][2], 0.0426206448347375, eps)");
  acutest_check_((uint)(ABS(m.m[0][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x117,"%s","float_equals(m.m[0][3], 0.0)");
  acutest_check_((uint)(ABS(m.m[1][0] + -0.6670022079522818) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x119,"%s","float_equals(m.m[1][0], 0.6670022079522818, eps)");
  acutest_check_((uint)(ABS(m.m[1][1] + -0.6911539437437854) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x11a,"%s","float_equals(m.m[1][1], 0.6911539437437854, eps)");
  acutest_check_((uint)(ABS(m.m[1][2] + -0.2782342190209419) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x11b,"%s","float_equals(m.m[1][2], 0.2782342190209419, eps)");
  acutest_check_((uint)(ABS(m.m[1][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x11c,"%s","float_equals(m.m[1][3], 0.0)");
  acutest_check_((uint)(ABS(m.m[2][0] + 0.224951054343865) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x11e,"%s","float_equals(m.m[2][0], -0.224951054343865, eps)");
  acutest_check_((uint)(ABS(m.m[2][1] + 0.16919758612316493) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x11f,"%s","float_equals(m.m[2][1], -0.16919758612316493, eps)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][2]._1_7_,m.m[2][2]._0_1_) + -0.9595671941035071)
                       < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x120,"%s","float_equals(m.m[2][2], 0.9595671941035071, eps)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][3]._1_7_,m.m[2][3]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x121,"%s","float_equals(m.m[2][3], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[3][0]._1_7_,m.m[3][0]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x123,"%s","float_equals(m.m[3][0], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x124,"%s","float_equals(m.m[3][1], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][2]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x125,"%s","float_equals(m.m[3][2], 0.0)");
  acutest_check_((uint)(ABS(m.m[3][3] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x126,"%s","float_equals(m.m[3][3], 1.0)");
  std::__cxx11::string::~string((string *)&err);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::~vector(&x.xformOps);
  tinyusdz::XformOp::~XformOp((XformOp *)&c);
  err._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  err._M_string_length = 0x3ff0000000000000;
  err.field_2._M_allocated_capacity = 0x3ff0000000000000;
  scale._M_elems[0] = 1.5;
  scale._M_elems[1] = 0.5;
  scale._M_elems[2] = 2.5;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  x.xformOps.super__Vector_base<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  x._dirty = true;
  x._matrix.m[0][0] = 1.0;
  x._matrix.m[0][1] = 0.0;
  x._matrix.m[0][2] = 0.0;
  x._matrix.m[0][3] = 0.0;
  x._matrix.m[1][0] = 0.0;
  x._matrix.m[1][1] = 1.0;
  x._matrix.m[1][2] = 0.0;
  x._matrix.m[1][3] = 0.0;
  x._matrix.m[2][0] = 0.0;
  x._matrix.m[2][1] = 0.0;
  x._matrix.m[2][2] = 1.0;
  pdVar1 = m.m[0] + 3;
  m.m[0][2] = 0.0;
  x._matrix.m[2][3] = 0.0;
  x._matrix.m[3][0] = 0.0;
  m.m[0][3] = (double)((ulong)m.m[0][3] & 0xffffffffffffff00);
  m.m[1][3] = (double)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  m.m[1][1] = 0.0;
  x._matrix.m[3][1] = 0.0;
  x._matrix.m[3][2] = 0.0;
  x._matrix.m[3][3] = 1.0;
  m.m[2][0] = (double)((ulong)m.m[2][0] & 0xffffffffffffff00);
  m.m[2][1] = 0.0;
  m.m[2][2]._0_1_ = 0;
  m.m[2][2]._1_7_ = 0;
  m.m[2][3]._0_1_ = 0;
  m.m[2][3]._1_7_ = 0;
  m.m[3][0]._0_1_ = 0;
  m.m[3][1] = (double)((ulong)m.m[3][1] & 0xffffffffffffff00);
  m.m[0][0] = (double)CONCAT35(m.m[0][0]._5_3_,1);
  m.m[0][1] = (double)pdVar1;
  linb::any::operator=((any *)(m.m[1] + 1),(array<double,_3UL> *)&err);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            (&x.xformOps,(value_type *)&m);
  tinyusdz::XformOp::~XformOp((XformOp *)&m);
  m.m[0][2] = 0.0;
  m.m[0][3] = (double)((ulong)m.m[0][3] & 0xffffffffffffff00);
  m.m[1][3] = (double)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  m.m[1][1] = 0.0;
  m.m[2][0] = (double)((ulong)m.m[2][0] & 0xffffffffffffff00);
  m.m[2][1] = 0.0;
  m.m[2][2]._0_1_ = 0;
  m.m[2][2]._1_7_ = 0;
  m.m[2][3]._0_1_ = 0;
  m.m[2][3]._1_7_ = 0;
  m.m[3][0]._0_1_ = 0;
  m.m[3][1] = (double)((ulong)m.m[3][1] & 0xffffffffffffff00);
  m.m[0][0] = (double)CONCAT35(m.m[0][0]._5_3_,2);
  m.m[0][1] = (double)pdVar1;
  linb::any::operator=((any *)(m.m[1] + 1),&scale);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::push_back
            (&x.xformOps,(value_type *)&m);
  tinyusdz::XformOp::~XformOp((XformOp *)&m);
  m.m[0][0] = 1.0;
  m.m[0][1] = 0.0;
  m.m[0][2] = 0.0;
  m.m[0][3] = 0.0;
  m.m[1][0] = 0.0;
  m.m[1][1] = 1.0;
  m.m[1][2] = 0.0;
  m.m[1][3] = 0.0;
  m.m[2][0] = 0.0;
  m.m[2][1] = 0.0;
  m.m[2][2]._0_1_ = 0;
  m.m[2][2]._1_7_ = 0x3ff00000000000;
  m.m[2][3]._0_1_ = 0;
  m.m[2][3]._1_7_ = 0;
  m.m[3][0]._0_1_ = 0;
  m.m[3][0]._1_7_ = 0;
  m.m[3][1] = 0.0;
  m.m[3][2] = 0.0;
  m.m[3][3] = 1.0;
  c.m[0][0] = (double)(c.m[0] + 2);
  c.m[0][1] = 0.0;
  c.m[0][2] = (double)((ulong)c.m[0][2] & 0xffffffffffffff00);
  bVar3 = tinyusdz::Xformable::EvaluateXformOps(&x,NAN,Held,&m,&resetXformStack,(string *)&c);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x14a,"%s","ret");
  poVar4 = std::operator<<((ostream *)&std::cout,"trans x scale = ");
  poVar4 = std::operator<<(poVar4,&m);
  std::operator<<(poVar4,"\n");
  acutest_check_((uint)(ABS(m.m[0][0] + -1.5) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x14f,"%s","float_equals(m.m[0][0], 1.5)");
  acutest_check_((uint)(ABS(m.m[0][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x150,"%s","float_equals(m.m[0][1], 0.0)");
  acutest_check_((uint)(ABS(m.m[0][2]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x151,"%s","float_equals(m.m[0][2], 0.0)");
  acutest_check_((uint)(ABS(m.m[0][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x152,"%s","float_equals(m.m[0][3], 0.0)");
  acutest_check_((uint)(ABS(m.m[1][0]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x154,"%s","float_equals(m.m[1][0], 0.0)");
  acutest_check_((uint)(ABS(m.m[1][1] + -0.5) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x155,"%s","float_equals(m.m[1][1], 0.5)");
  acutest_check_((uint)(ABS(m.m[1][2]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x156,"%s","float_equals(m.m[1][2], 0.0)");
  acutest_check_((uint)(ABS(m.m[1][3]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x157,"%s","float_equals(m.m[1][3], 0.0)");
  acutest_check_((uint)(ABS(m.m[2][0]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x159,"%s","float_equals(m.m[2][0], 0.0)");
  acutest_check_((uint)(ABS(m.m[2][1]) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x15a,"%s","float_equals(m.m[2][1], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][2]._1_7_,m.m[2][2]._0_1_) + -2.5) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x15b,"%s","float_equals(m.m[2][2], 2.5)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[2][3]._1_7_,m.m[2][3]._0_1_)) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x15c,"%s","float_equals(m.m[2][3], 0.0)");
  acutest_check_((uint)(ABS((double)CONCAT71(m.m[3][0]._1_7_,m.m[3][0]._0_1_) + -1.0) <
                       2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x15e,"%s","float_equals(m.m[3][0], 1.0)");
  acutest_check_((uint)(ABS(m.m[3][1] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x15f,"%s","float_equals(m.m[3][1], 1.0)");
  acutest_check_((uint)(ABS(m.m[3][2] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x160,"%s","float_equals(m.m[3][2], 1.0)");
  acutest_check_((uint)(ABS(m.m[3][3] + -1.0) < 2.220446049250313e-16),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-xform.cc"
                 ,0x161,"%s","float_equals(m.m[3][3], 1.0)");
  std::__cxx11::string::~string((string *)&c);
  std::vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_>::~vector(&x.xformOps);
  return;
}

Assistant:

void xformOp_test(void) {

  {
    value::double3 scale = {1.0, 2.0, 3.0};

    XformOp op;
    op.op_type = XformOp::OpType::Scale;
    op.inverted = true;
    op.set_value(scale);


    Xformable x;
    x.xformOps.push_back(op);

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);
    TEST_CHECK(ret == true);

    TEST_CHECK(float_equals(m.m[0][0], 1.0));
    TEST_CHECK(float_equals(m.m[1][1], 1.0/2.0));
    TEST_CHECK(float_equals(m.m[2][2], 1.0/3.0));

  }

  {
    value::matrix4d a;
    a.m[0][0] = 0;
    a.m[0][1] = 0;
    a.m[0][2] = 1;
    a.m[0][3] = 0;
    a.m[1][0] = 0;
    a.m[1][1] = 1;
    a.m[1][2] = 0;
    a.m[1][3] = 0;

    a.m[2][0] = -1;
    a.m[2][1] = 0;
    a.m[2][2] = 0;
    a.m[2][3] = 0;
    a.m[3][0] = 0.44200000166893005;
    a.m[3][1] = -7.5320000648498535;
    a.m[3][2] = 18.611000061035156;
    a.m[3][3] = 1;

    value::matrix4d b = value::matrix4d::identity();
    b.m[3][2] = -30.0;

    value::matrix4d c = a * b;
    std::cout << c << "\n";

    // expected: (0, 0, 1, 0), (0, 1, 0, 0), (-1, 0, 0, 0), (0.442, -7.532, -11.389, 1)
    TEST_CHECK(float_equals(c.m[0][0], 0.0));
    TEST_CHECK(float_equals(c.m[0][1], 0.0));
    TEST_CHECK(float_equals(c.m[0][2], 1.0));
    TEST_CHECK(float_equals(c.m[0][3], 0.0));

    TEST_CHECK(float_equals(c.m[1][0], 0.0));
    TEST_CHECK(float_equals(c.m[1][1], 1.0));
    TEST_CHECK(float_equals(c.m[1][2], 0.0));
    TEST_CHECK(float_equals(c.m[1][3], 0.0));

    TEST_CHECK(float_equals(c.m[2][0], -1.0));
    TEST_CHECK(float_equals(c.m[2][1], 0.0));
    TEST_CHECK(float_equals(c.m[2][2], 0.0));
    TEST_CHECK(float_equals(c.m[2][3], 0.0));

    TEST_CHECK(float_equals(c.m[3][0], 0.442, 0.00001));
    TEST_CHECK(float_equals(c.m[3][1], -7.532, 0.00001));
    TEST_CHECK(float_equals(c.m[3][2], -11.389, 0.00001));
    TEST_CHECK(float_equals(c.m[3][3], 1.0));


  }

  // RotateXYZ 000
  {
    value::double3 rotXYZ = {90.0, 0.0, 0.0};

    XformOp op;
    op.op_type = XformOp::OpType::RotateXYZ;
    op.inverted = false;
    op.set_value(rotXYZ);

    Xformable x;
    x.xformOps.push_back(op);

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);

    TEST_CHECK(ret);
    
    std::cout << "rotXYZ = " << m << "\n";

    //double eps = std::numeric_limits<double>::epsilon();

    // NOTE: in pxrUSD ret = ( (1, 0, 0, 0), (0, 6.12323e-17, 1, 0), (0, -1, 6.12323e-17, 0), (0, 0, 0, 1) )
    TEST_CHECK(float_equals(m.m[0][0], 1.0));
    TEST_CHECK(float_equals(m.m[0][1], 0.0));
    TEST_CHECK(float_equals(m.m[0][2], 0.0));
    TEST_CHECK(float_equals(m.m[0][3], 0.0));

    TEST_CHECK(float_equals(m.m[1][0], 0.0));
    TEST_CHECK(float_equals(m.m[1][1], 0.0));
    TEST_CHECK(float_equals(m.m[1][2], 1.0));
    TEST_CHECK(float_equals(m.m[1][3], 0.0));

    TEST_CHECK(float_equals(m.m[2][0], 0.0));
    TEST_CHECK(float_equals(m.m[2][1], -1.0));
    TEST_CHECK(float_equals(m.m[2][2], 0.0));
    TEST_CHECK(float_equals(m.m[2][3], 0.0));

    TEST_CHECK(float_equals(m.m[3][0], 0.0));
    TEST_CHECK(float_equals(m.m[3][1], 0.0));
    TEST_CHECK(float_equals(m.m[3][2], 0.0));
    TEST_CHECK(float_equals(m.m[3][3], 1.0));



  }

  // RotateXYZ 001
  {
    value::double3 rotXYZ = {0.0, 0.0, -65.66769};

    XformOp op;
    op.op_type = XformOp::OpType::RotateXYZ;
    op.inverted = false;
    op.set_value(rotXYZ);

    Xformable x;
    x.xformOps.push_back(op);

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);

    TEST_CHECK(ret);
    
    std::cout << "rotXYZ = " << m << "\n";

    // 0.4120283041870241, -0.9111710468121587, 0, 0
    // 0.9111710468121587, 0.4120283041870241, 0, 0
    // 0, 0, 1, 0
    // 0, 0, 0, 1
    TEST_CHECK(float_equals(m.m[0][0], 0.4120283041870241, 0.00001));
    TEST_CHECK(float_equals(m.m[0][1], -0.9111710468121587, 0.00001));
    TEST_CHECK(float_equals(m.m[0][2], 0.0));
    TEST_CHECK(float_equals(m.m[0][3], 0.0));

    TEST_CHECK(float_equals(m.m[1][0], 0.9111710468121587, 0.00001));
    TEST_CHECK(float_equals(m.m[1][1], 0.4120283041870241, 0.00001));
    TEST_CHECK(float_equals(m.m[1][2], 0.0));
    TEST_CHECK(float_equals(m.m[1][3], 0.0));

    TEST_CHECK(float_equals(m.m[2][0], 0.0));
    TEST_CHECK(float_equals(m.m[2][1], 0.0));
    TEST_CHECK(float_equals(m.m[2][2], 1.0));
    TEST_CHECK(float_equals(m.m[2][3], 0.0));

    TEST_CHECK(float_equals(m.m[3][0], 0.0));
    TEST_CHECK(float_equals(m.m[3][1], 0.0));
    TEST_CHECK(float_equals(m.m[3][2], 0.0));
    TEST_CHECK(float_equals(m.m[3][3], 1.0));
  }

  // RotateXYZ 002
  {
    value::double3 rotXYZ = {10.0, 23.0, 43.2};

    XformOp op;
    op.op_type = XformOp::OpType::RotateXYZ;
    op.inverted = false;
    op.set_value(rotXYZ);

    Xformable x;
    x.xformOps.push_back(op);

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);

    TEST_CHECK(ret);
    
    std::cout << "rotXYZ = " << m << "\n";

    double eps = std::numeric_limits<double>::epsilon();

    // numeric value is grabbed from pxrUSD.
    // There are slight eps error for [0][1], [1][0] and [1][1], so twice eps
    TEST_CHECK(float_equals(m.m[0][0], 0.6710191595559729, eps));
    TEST_CHECK(float_equals(m.m[0][1], 0.6301289334241799, eps));
    TEST_CHECK(float_equals(m.m[0][2], -0.39073112848927377, eps));
    TEST_CHECK(float_equals(m.m[0][3], 0.0));

    TEST_CHECK(float_equals(m.m[1][0], -0.6246869592440953, eps));
    TEST_CHECK(float_equals(m.m[1][1], 0.7643403049061097, eps));
    TEST_CHECK(float_equals(m.m[1][2], 0.15984399033558103, eps));
    TEST_CHECK(float_equals(m.m[1][3], 0.0));

    TEST_CHECK(float_equals(m.m[2][0], 0.3993738730302244, eps));
    TEST_CHECK(float_equals(m.m[2][1], 0.13682626048292368, eps));
    TEST_CHECK(float_equals(m.m[2][2], 0.9065203163653295, eps));
    TEST_CHECK(float_equals(m.m[2][3], 0.0));

    TEST_CHECK(float_equals(m.m[3][0], 0.0));
    TEST_CHECK(float_equals(m.m[3][1], 0.0));
    TEST_CHECK(float_equals(m.m[3][2], 0.0));
    TEST_CHECK(float_equals(m.m[3][3], 1.0));
  }

  // Rotate 003
  {
    value::double3 rotXYZ = {-10.0, 13.0, 43.2};

    XformOp op;
    op.op_type = XformOp::OpType::RotateXYZ;
    op.inverted = true;
    op.set_value(rotXYZ);

    Xformable x;
    x.xformOps.push_back(op);

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);

    TEST_CHECK(ret);
    
    std::cout << "rotXYZ = " << m << "\n";

    double eps = std::numeric_limits<double>::epsilon();

  
    TEST_CHECK(float_equals(m.m[0][0], 0.7102852087270047, eps));
    TEST_CHECK(float_equals(m.m[0][1], -0.7026225180689177, eps));
    TEST_CHECK(float_equals(m.m[0][2], 0.0426206448347375, eps));
    TEST_CHECK(float_equals(m.m[0][3], 0.0));

    TEST_CHECK(float_equals(m.m[1][0], 0.6670022079522818, eps));
    TEST_CHECK(float_equals(m.m[1][1], 0.6911539437437854, eps));
    TEST_CHECK(float_equals(m.m[1][2], 0.2782342190209419, eps));
    TEST_CHECK(float_equals(m.m[1][3], 0.0));

    TEST_CHECK(float_equals(m.m[2][0], -0.224951054343865, eps));
    TEST_CHECK(float_equals(m.m[2][1], -0.16919758612316493, eps));
    TEST_CHECK(float_equals(m.m[2][2], 0.9595671941035071, eps));
    TEST_CHECK(float_equals(m.m[2][3], 0.0));

    TEST_CHECK(float_equals(m.m[3][0], 0.0));
    TEST_CHECK(float_equals(m.m[3][1], 0.0));
    TEST_CHECK(float_equals(m.m[3][2], 0.0));
    TEST_CHECK(float_equals(m.m[3][3], 1.0));
  }

  // trans x scale
  // scale firstly applied, then translation.
  {
    value::double3 trans = {1.0, 1.0, 1.0};
    value::double3 scale = {1.5, 0.5, 2.5};

    Xformable x;
    {
      XformOp op;
      op.op_type = XformOp::OpType::Translate;
      op.inverted = false;
      op.set_value(trans);

      x.xformOps.push_back(op);
    }

    {
      XformOp op;
      op.op_type = XformOp::OpType::Scale;
      op.inverted = false;
      op.set_value(scale);

      x.xformOps.push_back(op);
    }

    value::matrix4d m;
    bool resetXformStack;
    std::string err;
    double t = value::TimeCode::Default();
    value::TimeSampleInterpolationType tinterp = value::TimeSampleInterpolationType::Held;

    bool ret = x.EvaluateXformOps(t, tinterp, &m, &resetXformStack, &err);

    TEST_CHECK(ret);
    
    std::cout << "trans x scale = " << m << "\n";

    // 1.5 0 0 0, 0 1.5 0 0, 0 0 1.5 0, 1 0 0 1
    TEST_CHECK(float_equals(m.m[0][0], 1.5));
    TEST_CHECK(float_equals(m.m[0][1], 0.0));
    TEST_CHECK(float_equals(m.m[0][2], 0.0));
    TEST_CHECK(float_equals(m.m[0][3], 0.0));

    TEST_CHECK(float_equals(m.m[1][0], 0.0));
    TEST_CHECK(float_equals(m.m[1][1], 0.5));
    TEST_CHECK(float_equals(m.m[1][2], 0.0));
    TEST_CHECK(float_equals(m.m[1][3], 0.0));

    TEST_CHECK(float_equals(m.m[2][0], 0.0));
    TEST_CHECK(float_equals(m.m[2][1], 0.0));
    TEST_CHECK(float_equals(m.m[2][2], 2.5));
    TEST_CHECK(float_equals(m.m[2][3], 0.0));

    TEST_CHECK(float_equals(m.m[3][0], 1.0));
    TEST_CHECK(float_equals(m.m[3][1], 1.0));
    TEST_CHECK(float_equals(m.m[3][2], 1.0));
    TEST_CHECK(float_equals(m.m[3][3], 1.0));

  }


}